

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_args.cc
# Opt level: O0

options_i * load_header_merge_options(options_i *options,vw *all,io_buf *model)

{
  bool bVar1;
  ulong uVar2;
  char *pcVar3;
  size_type sVar4;
  reference pbVar5;
  basic_command_line_parser<char> *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> value_1;
  iterator __end3_1;
  iterator __begin3_1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range3_1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  source;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> value;
  iterator __end4;
  iterator __begin4;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range4;
  bool treat_as_value;
  size_type found;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> token;
  iterator __end3;
  iterator __begin3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range3;
  basic_option<char> opt;
  iterator __end1;
  iterator __begin1;
  vector<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>
  *__range1;
  bool first_seen;
  uint count;
  string saved_key;
  bool skipping;
  parsed_options pos;
  options_description desc;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  container;
  istringstream ss;
  string file_options;
  options_i *in_stack_00000bf0;
  string *in_stack_00000bf8;
  undefined1 in_stack_00000c06;
  undefined1 in_stack_00000c07;
  io_buf *in_stack_00000c08;
  vw *in_stack_00000c10;
  options_description *in_stack_fffffffffffff9e8;
  basic_command_line_parser<char> *in_stack_fffffffffffff9f0;
  undefined7 in_stack_fffffffffffffa00;
  undefined1 in_stack_fffffffffffffa07;
  basic_option<char> *in_stack_fffffffffffffa08;
  basic_command_line_parser<char> *in_stack_fffffffffffffa10;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffa18;
  allocator *paVar6;
  undefined4 in_stack_fffffffffffffa20;
  undefined1 in_stack_fffffffffffffa24;
  undefined1 in_stack_fffffffffffffa25;
  undefined1 in_stack_fffffffffffffa26;
  undefined1 in_stack_fffffffffffffa27;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffa38;
  allocator *this;
  undefined7 in_stack_fffffffffffffa68;
  undefined1 uVar7;
  string *this_00;
  istream_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::char_traits<char>,_long>
  *in_stack_fffffffffffffa80;
  istream_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::char_traits<char>,_long>
  *in_stack_fffffffffffffa88;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffa90;
  string local_558 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_538;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_530;
  undefined1 *local_528;
  undefined1 local_520 [24];
  string local_508 [8];
  string *in_stack_fffffffffffffb00;
  options_i *in_stack_fffffffffffffb08;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_4e0;
  undefined1 *local_4d8;
  allocator local_4c9;
  string local_4c8 [35];
  byte local_4a5;
  undefined4 local_4a4;
  long local_4a0;
  string local_498 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_478;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_470;
  undefined1 *local_468;
  string local_460 [40];
  undefined1 auStack_438 [56];
  basic_option<char> *local_400;
  __normal_iterator<boost::program_options::basic_option<char>_*,_std::vector<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>_>
  local_3f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_3f0;
  byte local_3e1;
  int local_3e0;
  allocator local_3d9;
  string local_3d8 [39];
  byte local_3b1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_338;
  allocator local_309;
  string local_308 [32];
  options_description local_2e8 [256];
  istringstream local_1e8 [384];
  string local_68 [48];
  string local_38 [48];
  basic_command_line_parser<char> *local_8;
  
  this_00 = local_38;
  local_8 = in_RDI;
  std::__cxx11::string::string(this_00);
  save_load_header(in_stack_00000c10,in_stack_00000c08,(bool)in_stack_00000c07,
                   (bool)in_stack_00000c06,in_stack_00000bf8,in_stack_00000bf0);
  std::__cxx11::string::string(local_68,local_38);
  interactions_settings_doubled =
       check_interaction_settings_collision(in_stack_fffffffffffffb08,in_stack_fffffffffffffb00);
  uVar7 = interactions_settings_doubled;
  std::__cxx11::string::~string(local_68);
  std::__cxx11::istringstream::istringstream(local_1e8,local_38,_S_in);
  std::
  istream_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::char_traits<char>,_long>
  ::istream_iterator((istream_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::char_traits<char>,_long>
                      *)in_stack_fffffffffffffa10,(istream_type *)in_stack_fffffffffffffa08);
  std::
  istream_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::char_traits<char>,_long>
  ::istream_iterator((istream_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::char_traits<char>,_long>
                      *)in_stack_fffffffffffff9f0);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)0x17b3b7);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  vector<std::istream_iterator<std::__cxx11::string,char,std::char_traits<char>,long>,void>
            (in_stack_fffffffffffffa90,in_stack_fffffffffffffa88,in_stack_fffffffffffffa80,
             (allocator_type *)this_00);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)0x17b3e8);
  std::
  istream_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::char_traits<char>,_long>
  ::~istream_iterator((istream_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::char_traits<char>,_long>
                       *)0x17b3f5);
  std::
  istream_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::char_traits<char>,_long>
  ::~istream_iterator((istream_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::char_traits<char>,_long>
                       *)0x17b402);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_308,"",&local_309);
  boost::program_options::options_description::options_description
            (local_2e8,local_308,
             (uint)boost::program_options::options_description::m_default_line_length,
             (uint)boost::program_options::options_description::m_default_line_length >> 1);
  std::__cxx11::string::~string(local_308);
  std::allocator<char>::~allocator((allocator<char> *)&local_309);
  boost::program_options::basic_command_line_parser<char>::basic_command_line_parser
            ((basic_command_line_parser<char> *)
             CONCAT17(in_stack_fffffffffffffa27,
                      CONCAT16(in_stack_fffffffffffffa26,
                               CONCAT15(in_stack_fffffffffffffa25,
                                        CONCAT14(in_stack_fffffffffffffa24,in_stack_fffffffffffffa20
                                                )))),in_stack_fffffffffffffa18);
  boost::program_options::basic_command_line_parser<char>::options
            (in_stack_fffffffffffff9f0,in_stack_fffffffffffff9e8);
  boost::program_options::basic_command_line_parser<char>::allow_unregistered
            (in_stack_fffffffffffff9f0);
  boost::program_options::basic_command_line_parser<char>::run
            ((basic_command_line_parser<char> *)CONCAT17(uVar7,in_stack_fffffffffffffa68));
  boost::program_options::basic_command_line_parser<char>::~basic_command_line_parser
            ((basic_command_line_parser<char> *)0x17b4d2);
  local_3b1 = 0;
  this = &local_3d9;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_3d8,"",this);
  std::allocator<char>::~allocator((allocator<char> *)&local_3d9);
  local_3e0 = 0;
  local_3e1 = 0;
  local_3f0 = &local_338;
  local_3f8._M_current =
       (basic_option<char> *)
       std::
       vector<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>
       ::begin((vector<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>
                *)in_stack_fffffffffffff9e8);
  local_400 = (basic_option<char> *)
              std::
              vector<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>
              ::end((vector<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>
                     *)in_stack_fffffffffffff9e8);
  do {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<boost::program_options::basic_option<char>_*,_std::vector<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>_>
                        *)in_stack_fffffffffffff9f0,
                       (__normal_iterator<boost::program_options::basic_option<char>_*,_std::vector<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>_>
                        *)in_stack_fffffffffffff9e8);
    if (!bVar1) {
      if ((local_3e0 == 0) &&
         (in_stack_fffffffffffffa07 =
               std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               in_stack_fffffffffffff9f0,(char *)in_stack_fffffffffffff9e8),
         (bool)in_stack_fffffffffffffa07)) {
        in_stack_fffffffffffff9f0 = local_8;
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&stack0xfffffffffffffa88,"",(allocator *)&stack0xfffffffffffffa87);
        (*(*(_func_int ***)in_stack_fffffffffffff9f0)[5])
                  (in_stack_fffffffffffff9f0,local_3d8,&stack0xfffffffffffffa88);
        std::__cxx11::string::~string((string *)&stack0xfffffffffffffa88);
        std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffa87);
      }
      local_4a4 = 1;
      std::__cxx11::string::~string(local_3d8);
      boost::program_options::basic_parsed_options<char>::~basic_parsed_options
                ((basic_parsed_options<char> *)0x17be89);
      boost::program_options::options_description::~options_description
                ((options_description *)in_stack_fffffffffffff9f0);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)CONCAT17(in_stack_fffffffffffffa07,in_stack_fffffffffffffa00));
      std::__cxx11::istringstream::~istringstream(local_1e8);
      std::__cxx11::string::~string(local_38);
      return (options_i *)local_8;
    }
    __gnu_cxx::
    __normal_iterator<boost::program_options::basic_option<char>_*,_std::vector<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>_>
    ::operator*(&local_3f8);
    boost::program_options::basic_option<char>::basic_option
              ((basic_option<char> *)in_stack_fffffffffffffa10,in_stack_fffffffffffffa08);
    if ((local_3b1 & 1) == 0) {
LAB_0017b842:
      local_4a5 = 0;
      uVar2 = std::__cxx11::string::length();
      if ((((1 < uVar2) &&
           (in_stack_fffffffffffffa38 =
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)std::__cxx11::string::operator[]((ulong)local_460),
           *(char *)&(in_stack_fffffffffffffa38->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start == '-')) &&
          (pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)local_460), '/' < *pcVar3)) &&
         (pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)local_460), *pcVar3 < ':')) {
        local_4a5 = 1;
      }
      if (((interactions_settings_doubled & 1U) == 0) ||
         (((bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)in_stack_fffffffffffff9f0,(char *)in_stack_fffffffffffff9e8),
           !bVar1 && (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                               *)in_stack_fffffffffffff9f0,
                                              (char *)in_stack_fffffffffffff9e8), !bVar1)) &&
          (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)in_stack_fffffffffffff9f0,(char *)in_stack_fffffffffffff9e8),
          !bVar1)))) {
        if (((local_4a5 & 1) == 0) &&
           (bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)in_stack_fffffffffffff9f0,(char *)in_stack_fffffffffffff9e8),
           bVar1)) {
          if ((local_3e0 == 0) && ((local_3e1 & 1) != 0)) {
            paVar6 = &local_4c9;
            in_stack_fffffffffffffa10 = local_8;
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_4c8,"",paVar6);
            (*(*(_func_int ***)in_stack_fffffffffffffa10)[5])
                      (in_stack_fffffffffffffa10,local_3d8,local_4c8);
            std::__cxx11::string::~string(local_4c8);
            std::allocator<char>::~allocator((allocator<char> *)&local_4c9);
          }
          std::__cxx11::string::operator=(local_3d8,local_460);
          local_3e0 = 0;
          local_3e1 = 1;
          sVar4 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)auStack_438);
          if (sVar4 != 0) {
            local_4d8 = auStack_438;
            local_4e0._M_current =
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)in_stack_fffffffffffff9e8);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)in_stack_fffffffffffff9e8);
            while (bVar1 = __gnu_cxx::operator!=
                                     ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                       *)in_stack_fffffffffffff9f0,
                                      (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                       *)in_stack_fffffffffffff9e8), bVar1) {
              pbVar5 = __gnu_cxx::
                       __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       ::operator*(&local_4e0);
              std::__cxx11::string::string(local_508,(string *)pbVar5);
              (*(*(_func_int ***)local_8)[5])(local_8,local_3d8,local_508);
              local_3e0 = local_3e0 + 1;
              std::__cxx11::string::~string(local_508);
              __gnu_cxx::
              __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator++(&local_4e0);
            }
          }
        }
        else {
          if ((local_4a5 & 1) == 0) {
            in_stack_fffffffffffffa08 = (basic_option<char> *)auStack_438;
          }
          else {
            in_stack_fffffffffffffa08 = (basic_option<char> *)(auStack_438 + 0x18);
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)this,in_stack_fffffffffffffa38);
          local_528 = local_520;
          local_530._M_current =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)in_stack_fffffffffffff9e8);
          local_538 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      std::
                      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)in_stack_fffffffffffff9e8);
          while (bVar1 = __gnu_cxx::operator!=
                                   ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                     *)in_stack_fffffffffffff9f0,
                                    (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                     *)in_stack_fffffffffffff9e8), bVar1) {
            pbVar5 = __gnu_cxx::
                     __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ::operator*(&local_530);
            std::__cxx11::string::string(local_558,(string *)pbVar5);
            (*(*(_func_int ***)local_8)[5])(local_8,local_3d8,local_558);
            local_3e0 = local_3e0 + 1;
            std::__cxx11::string::~string(local_558);
            __gnu_cxx::
            __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator++(&local_530);
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)CONCAT17(in_stack_fffffffffffffa07,in_stack_fffffffffffffa00));
        }
        local_4a4 = 0;
      }
      else {
        local_3b1 = 1;
        local_4a4 = 3;
      }
    }
    else {
      local_468 = auStack_438 + 0x18;
      local_470._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)in_stack_fffffffffffff9e8);
      local_478 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)in_stack_fffffffffffff9e8);
      while (bVar1 = __gnu_cxx::operator!=
                               ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 *)in_stack_fffffffffffff9f0,
                                (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 *)in_stack_fffffffffffff9e8), bVar1) {
        pbVar5 = __gnu_cxx::
                 __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator*(&local_470);
        std::__cxx11::string::string(local_498,(string *)pbVar5);
        local_4a0 = std::__cxx11::string::find((char *)local_498,0x3fdeb4);
        if (local_4a0 != -1) {
          local_3b1 = 0;
        }
        std::__cxx11::string::~string(local_498);
        __gnu_cxx::
        __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator++(&local_470);
      }
      if ((local_3b1 & 1) == 0) goto LAB_0017b842;
      std::__cxx11::string::operator=(local_3d8,"");
      local_4a4 = 3;
    }
    boost::program_options::basic_option<char>::~basic_option
              ((basic_option<char> *)in_stack_fffffffffffff9f0);
    __gnu_cxx::
    __normal_iterator<boost::program_options::basic_option<char>_*,_std::vector<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>_>
    ::operator++(&local_3f8);
  } while( true );
}

Assistant:

options_i& load_header_merge_options(options_i& options, vw& all, io_buf& model)
{
  std::string file_options;
  save_load_header(all, model, true, false, file_options, options);

  interactions_settings_doubled = check_interaction_settings_collision(options, file_options);

  // Convert file_options into a vector.
  std::istringstream ss{file_options};
  std::vector<std::string> container{std::istream_iterator<std::string>{ss}, std::istream_iterator<std::string>{}};

  po::options_description desc("");

  // Get list of options in file options string
  po::parsed_options pos = po::command_line_parser(container).options(desc).allow_unregistered().run();

  bool skipping = false;
  std::string saved_key = "";
  unsigned int count = 0;
  bool first_seen = false;
  for (auto opt : pos.options)
  {
    // If we previously encountered an option we want to skip, ignore tokens without --.
    if (skipping)
    {
      for (auto token : opt.original_tokens)
      {
        auto found = token.find("--");
        if (found != std::string::npos)
        {
          skipping = false;
        }
      }

      if (skipping)
      {
        saved_key = "";
        continue;
      }
    }

    bool treat_as_value = false;
    // If the key starts with a digit, this is a mis-interpretation of a value as a key. Pull it into the previous
    // option. This was found in the case of --lambda -1, misinterpreting -1 as an option key. The easy way to fix this
    // requires introducing "identifier-like" semantics for options keys, e.g. "does not begin with a digit". That does
    // not seem like an unreasonable restriction. The logical check here is: is "string_key" of the form {'-', <digit>,
    // <etc.>}.
    if (opt.string_key.length() > 1 && opt.string_key[0] == '-' && opt.string_key[1] >= '0' && opt.string_key[1] <= '9')
    {
      treat_as_value = true;
    }

    // If the interaction settings are doubled, the copy in the model file is ignored.
    if (interactions_settings_doubled &&
        (opt.string_key == "quadratic" || opt.string_key == "cubic" || opt.string_key == "interactions"))
    {
      // skip this option.
      skipping = true;
      continue;
    }

    // File options should always use long form.

    // If the key is empty this must be a value, otherwise set the key.
    if (!treat_as_value && opt.string_key != "")
    {
      // If the new token is a new option and there were no values previously it was a bool option. Add it as a switch.
      if (count == 0 && first_seen)
      {
        options.insert(saved_key, "");
      }

      saved_key = opt.string_key;
      count = 0;
      first_seen = true;

      if (opt.value.size() > 0)
      {
        for (auto value : opt.value)
        {
          options.insert(saved_key, value);
          count++;
        }
      }
    }
    else
    {
      // If treat_as_value is set, boost incorrectly interpreted the token as containing an option key
      // In this case, what should have happened is all original_tokens items should be in value.
      auto source = treat_as_value ? opt.original_tokens : opt.value;
      for (auto value : source)
      {
        options.insert(saved_key, value);
        count++;
      }
    }
  }

  if (count == 0 && saved_key != "")
  {
    options.insert(saved_key, "");
  }

  return options;
}